

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tableref.cpp
# Opt level: O0

void __thiscall duckdb::TableRef::CopyProperties(TableRef *this,TableRef *target)

{
  bool bVar1;
  shared_ptr<duckdb::ExternalDependency,_true> *in_RSI;
  shared_ptr<duckdb::ExternalDependency,_true> *in_RDI;
  SampleOptions *in_stack_00000058;
  unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>,_true>
  *in_stack_ffffffffffffffd8;
  shared_ptr<duckdb::ExternalDependency,_true> *this_00;
  
  this_00 = in_RDI;
  ::std::__cxx11::string::operator=((string *)(in_RSI + 1),(string *)(in_RDI + 1));
  in_RSI[3].internal.super___shared_ptr<duckdb::ExternalDependency,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       in_RDI[3].internal.super___shared_ptr<duckdb::ExternalDependency,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi;
  bVar1 = ::std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>
                      *)0x23bb95);
  if (bVar1) {
    unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>,_true>::operator->
              ((unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>,_true>
                *)in_RDI);
    SampleOptions::Copy(in_stack_00000058);
  }
  else {
    unique_ptr<duckdb::SampleOptions,std::default_delete<duckdb::SampleOptions>,true>::
    unique_ptr<std::default_delete<duckdb::SampleOptions>,void>
              ((unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>,_true>
                *)in_RDI,in_stack_ffffffffffffffd8);
  }
  unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>,_true>::operator=
            ((unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>,_true> *)
             in_RDI,in_stack_ffffffffffffffd8);
  unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>,_true>::~unique_ptr
            ((unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>,_true> *)
             0x23bbe3);
  shared_ptr<duckdb::ExternalDependency,_true>::operator=(this_00,in_RSI);
  return;
}

Assistant:

void TableRef::CopyProperties(TableRef &target) const {
	D_ASSERT(type == target.type);
	target.alias = alias;
	target.query_location = query_location;
	target.sample = sample ? sample->Copy() : nullptr;
	target.external_dependency = external_dependency;
}